

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> __thiscall
wasm::MultiMemoryLowering::memoryGrow(MultiMemoryLowering *this,Index memIdx,Name memoryName)

{
  BinaryOp BVar1;
  BinaryOp BVar2;
  Function *this_00;
  Module *pMVar3;
  pointer puVar4;
  Index index;
  long *plVar5;
  Call *value;
  MemorySize *value_00;
  LocalSet *append;
  Expression *pEVar6;
  MemoryGrow *pMVar7;
  Const *pCVar8;
  Binary *pBVar9;
  If *this_01;
  Binary *pBVar10;
  Expression *pEVar11;
  Binary *this_02;
  MemoryCopy *this_03;
  GlobalSet *this_04;
  Block *pBVar12;
  undefined1 uVar13;
  _Head_base<0UL,_wasm::Function_*,_false> *p_Var14;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  Builder *pBVar15;
  undefined4 in_register_00000034;
  ulong uVar16;
  Module *pMVar17;
  Type TVar18;
  ulong uVar19;
  pointer *__ptr;
  string_view sVar20;
  Name NVar21;
  Signature sig;
  optional<wasm::Type> type_;
  Name name;
  Name name_00;
  Name name_01;
  HeapType local_d8;
  undefined1 local_d0 [8];
  anon_class_8_1_911e227b pageSizeConst;
  anon_class_24_3_04b167d9 getOffsetDelta;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *function;
  undefined8 uStack_80;
  _Head_base<0UL,_wasm::Function_*,_false> local_78;
  size_t sStack_70;
  Index local_64;
  Type local_60;
  Block *local_58;
  uint local_4c;
  Block *local_48;
  Builder *local_40;
  Builder local_38;
  Builder builder;
  
  local_4c = (uint)memoryName.super_IString.str._M_len;
  local_38.wasm = ((Builder *)CONCAT44(in_register_00000034,memIdx))[0xb].wasm;
  pageSizeConst.builder = (Builder *)&getOffsetDelta.this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pageSizeConst);
  plVar5 = (long *)std::__cxx11::string::append((char *)&pageSizeConst);
  p_Var14 = (_Head_base<0UL,_wasm::Function_*,_false> *)(plVar5 + 2);
  if ((_Head_base<0UL,_wasm::Function_*,_false> *)*plVar5 == p_Var14) {
    local_78._M_head_impl = p_Var14->_M_head_impl;
    sStack_70 = plVar5[3];
    function = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_78;
  }
  else {
    local_78._M_head_impl = p_Var14->_M_head_impl;
    function = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)*plVar5;
  }
  uStack_80 = plVar5[1];
  *plVar5 = (long)p_Var14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  sVar20._M_str = (char *)0x0;
  sVar20._M_len = (size_t)function;
  local_40 = (Builder *)CONCAT44(in_register_00000034,memIdx);
  sVar20 = IString::interned((IString *)uStack_80,sVar20,SUB81(p_Var14,0));
  if ((_Head_base<0UL,_wasm::Function_*,_false> *)function != &local_78) {
    operator_delete(function,(ulong)((long)&((local_78._M_head_impl)->super_Importable).super_Named.
                                            name.super_IString.str._M_len + 1));
  }
  if (pageSizeConst.builder != (Builder *)&getOffsetDelta.this) {
    operator_delete(pageSizeConst.builder,
                    (ulong)((long)&((getOffsetDelta.this)->super_Pass)._vptr_Pass + 1));
  }
  pBVar15 = local_40;
  NVar21 = Names::getValidFunctionName(local_40[0xb].wasm,(Name)sVar20);
  sig.results.id = (uintptr_t)pBVar15[0xe].wasm;
  sig.params.id = (uintptr_t)pBVar15[0xe].wasm;
  HeapType::HeapType(&local_d8,sig);
  TVar18.id = (uintptr_t)&function;
  function = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0;
  uStack_80 = (char *)0x0;
  local_78._M_head_impl = (Function *)0x0;
  name_01.super_IString.str._M_str = NVar21.super_IString.str._M_len;
  name_01.super_IString.str._M_len = (size_t)this;
  Builder::makeFunction
            (name_01,(HeapType)NVar21.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_d8.id,(Expression *)TVar18.id)
  ;
  uVar13 = (undefined1)local_d8.id;
  if (function != (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0) {
    operator_delete(function,(long)local_78._M_head_impl - (long)function);
  }
  this_00 = (Function *)(this->super_Pass)._vptr_Pass;
  sVar20 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xdf210e),(bool)uVar13);
  pBVar15 = local_40;
  Function::setLocalName(this_00,0,(Name)sVar20);
  local_d0 = (undefined1  [8])&local_38;
  getOffsetDelta.this = (MultiMemoryLowering *)local_d0;
  getOffsetDelta.builder = pBVar15;
  pBVar15 = (Builder *)(this->super_Pass)._vptr_Pass;
  pageSizeConst.builder = (Builder *)local_d0;
  sVar20 = IString::interned((IString *)0xb,(string_view)ZEXT816(0xdf2119),
                             SUB81(getOffsetDelta.this,0));
  name.super_IString.str._M_len = sVar20._M_str;
  name.super_IString.str._M_str = (char *)local_40[0xe].wasm;
  local_64 = Builder::addVar(pBVar15,(Function *)sVar20._M_len,name,TVar18);
  pBVar15 = local_40;
  uVar19 = (ulong)local_4c;
  local_60.id = uVar19 * 0x10;
  args = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&function;
  function = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0;
  uStack_80 = (Module *)0x0;
  local_78._M_head_impl = (Function *)0x0;
  TVar18.id = (uintptr_t)local_40[0xe].wasm;
  NVar21.super_IString.str._M_str =
       (char *)(&((local_40[0x20].wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)[uVar19 * 2];
  NVar21.super_IString.str._M_len =
       (size_t)(&((local_40[0x20].wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)[uVar19 * 2];
  value = Builder::makeCall(&local_38,NVar21,args,TVar18,false);
  uVar13 = SUB81(args,0);
  local_48 = (Block *)Builder::makeLocalSet(&local_38,local_64,(Expression *)value);
  if ((local_48 == (Block *)0x0) ||
     ((((SpecificExpression<(wasm::Expression::Id)9> *)
       &local_48->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id !=
      BlockId)) {
    local_48 = Builder::makeBlock(&local_38,(Expression *)local_48);
  }
  if (function != (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0) {
    operator_delete(function,(long)local_78._M_head_impl - (long)function);
  }
  if ((long)pBVar15[0x17].wasm - (long)pBVar15[0x16].wasm >> 4 == uVar19) {
    index = 0xffffffff;
  }
  else {
    pBVar15 = (Builder *)(this->super_Pass)._vptr_Pass;
    sVar20 = IString::interned((IString *)0xb,(string_view)ZEXT816(0xdbff3a),(bool)uVar13);
    name_00.super_IString.str._M_len = sVar20._M_str;
    name_00.super_IString.str._M_str = (char *)local_40[0xe].wasm;
    index = Builder::addVar(pBVar15,(Function *)sVar20._M_len,name_00,TVar18);
    value_00 = Builder::makeMemorySize
                         (&local_38,(IString)*(IString *)&local_40[0xc].wasm,
                          *(MemoryInfo *)&local_40[0xf].wasm);
    append = Builder::makeLocalSet(&local_38,index,(Expression *)value_00);
    local_48 = Builder::blockify(&local_38,(Expression *)local_48,(Expression *)append);
    pBVar15 = local_40;
  }
  pMVar17 = pBVar15[0xe].wasm;
  pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar6->_id = LocalGetId;
  *(undefined4 *)(pEVar6 + 1) = 0;
  (pEVar6->type).id = (uintptr_t)pMVar17;
  pMVar7 = Builder::makeMemoryGrow
                     (&local_38,pEVar6,(IString)*(IString *)&local_40[0xc].wasm,
                      *(MemoryInfo *)&local_40[0xf].wasm);
  pCVar8 = Builder::makeConst<int>(&local_38,-1);
  pBVar9 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar9->op = EqInt32;
  pBVar9->left = (Expression *)pMVar7;
  pBVar9->right = (Expression *)pCVar8;
  Binary::finalize(pBVar9);
  local_58 = (Block *)Builder::makeConst<int>(&local_38,-1);
  pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar6->_id = ReturnId;
  (pEVar6->type).id = 1;
  *(Block **)(pEVar6 + 1) = local_58;
  uVar16 = 0x28;
  this_01 = (If *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_01->condition = (Expression *)pBVar9;
  this_01->ifTrue = pEVar6;
  this_01->ifFalse = (Expression *)0x0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar16;
  If::finalize(this_01,type_);
  local_58 = Builder::blockify(&local_38,(Expression *)local_48,(Expression *)this_01);
  pMVar17 = local_40[0x16].wasm;
  uVar16 = (long)local_40[0x17].wasm - (long)pMVar17 >> 4;
  if (uVar16 != uVar19) {
    if (local_4c == 0xffffffff) {
      local_48 = (Block *)0x0;
      local_60.id = 0;
    }
    else {
      local_48 = *(Block **)
                  ((long)&(pMVar17->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_60.id);
      local_60.id = *(uintptr_t *)
                     ((long)&(pMVar17->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + local_60.id);
    }
    pMVar17 = local_40[0xe].wasm;
    if (pMVar17 < (Module *)0x7) {
      BVar1 = *(BinaryOp *)(&DAT_00df2708 + (long)pMVar17 * 4);
      pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
      pEVar6->_id = GlobalGetId;
      *(Block **)(pEVar6 + 1) = local_48;
      pEVar6[1].type.id = local_60.id;
      (pEVar6->type).id = (uintptr_t)pMVar17;
      pBVar9 = memoryGrow::anon_class_24_3_04b167d9::operator()
                         ((anon_class_24_3_04b167d9 *)&pageSizeConst);
      pBVar10 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar10->op = BVar1;
      pBVar10->left = pEVar6;
      pBVar10->right = (Expression *)pBVar9;
      Binary::finalize(pBVar10);
      pMVar17 = local_40[0xe].wasm;
      pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
      pEVar6->_id = GlobalGetId;
      *(Block **)(pEVar6 + 1) = local_48;
      pEVar6[1].type.id = local_60.id;
      (pEVar6->type).id = (uintptr_t)pMVar17;
      pMVar17 = local_40[0xe].wasm;
      if (pMVar17 < (Module *)0x7) {
        BVar1 = *(BinaryOp *)(&DAT_00df26b4 + (long)pMVar17 * 4);
        BVar2 = *(BinaryOp *)(&DAT_00df26d0 + (long)pMVar17 * 4);
        pEVar11 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar11->_id = LocalGetId;
        *(Index *)(pEVar11 + 1) = index;
        (pEVar11->type).id = (uintptr_t)pMVar17;
        function = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                   CONCAT44(function._4_4_,0x10000);
        local_78._M_head_impl = (Function *)0x2;
        pCVar8 = Builder::makeConst((Builder *)local_d0,(Literal *)&function);
        Literal::~Literal((Literal *)&function);
        pBVar9 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId
        ;
        (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar9->op = BVar2;
        pBVar9->left = pEVar11;
        pBVar9->right = (Expression *)pCVar8;
        Binary::finalize(pBVar9);
        pMVar17 = local_40[0xe].wasm;
        pEVar11 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
        pEVar11->_id = GlobalGetId;
        *(Block **)(pEVar11 + 1) = local_48;
        pEVar11[1].type.id = local_60.id;
        (pEVar11->type).id = (uintptr_t)pMVar17;
        this_02 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        this_02->op = BVar1;
        this_02->left = (Expression *)pBVar9;
        this_02->right = pEVar11;
        Binary::finalize(this_02);
        pMVar17 = local_40[0xc].wasm;
        pMVar3 = local_40[0xd].wasm;
        function = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                   local_40[0xc].wasm;
        uStack_80 = local_40[0xd].wasm;
        this_03 = (MemoryCopy *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
        *(undefined8 *)
         &(this_03->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression = 0;
        (this_03->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id = 0;
        (this_03->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression._id =
             MemoryCopyId;
        this_03->dest = (Expression *)pBVar10;
        this_03->source = pEVar6;
        this_03->size = (Expression *)this_02;
        (this_03->destMemory).super_IString.str._M_len = (size_t)pMVar17;
        (this_03->destMemory).super_IString.str._M_str = (char *)pMVar3;
        (this_03->sourceMemory).super_IString.str._M_len = (size_t)function;
        (this_03->sourceMemory).super_IString.str._M_str = (char *)uStack_80;
        MemoryCopy::finalize(this_03);
        local_58 = Builder::blockify(&local_38,(Expression *)local_58,(Expression *)this_03);
        pMVar17 = local_40[0x16].wasm;
        uVar16 = (long)local_40[0x17].wasm - (long)pMVar17 >> 4;
        goto LAB_0098cb75;
      }
    }
LAB_0098cd08:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
LAB_0098cb75:
  if (uVar19 < uVar16) {
    local_4c = local_4c + 1;
    do {
      pMVar3 = local_40[0xe].wasm;
      if ((Module *)0x6 < pMVar3) goto LAB_0098cd08;
      puVar4 = (&(pMVar17->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)[uVar19 * 2];
      local_48 = (Block *)(&(pMVar17->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)[uVar19 * 2];
      BVar1 = *(BinaryOp *)(&DAT_00df2708 + (long)pMVar3 * 4);
      pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
      pEVar6->_id = GlobalGetId;
      *(pointer *)(pEVar6 + 1) = puVar4;
      pEVar6[1].type.id = (uintptr_t)local_48;
      (pEVar6->type).id = (uintptr_t)pMVar3;
      pBVar9 = memoryGrow::anon_class_24_3_04b167d9::operator()
                         ((anon_class_24_3_04b167d9 *)&pageSizeConst);
      pBVar10 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar10->op = BVar1;
      pBVar10->left = pEVar6;
      pBVar10->right = (Expression *)pBVar9;
      Binary::finalize(pBVar10);
      this_04 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (this_04->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (this_04->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (this_04->name).super_IString.str._M_len = (size_t)puVar4;
      (this_04->name).super_IString.str._M_str = (char *)local_48;
      this_04->value = (Expression *)pBVar10;
      GlobalSet::finalize(this_04);
      local_58 = Builder::blockify(&local_38,(Expression *)local_58,(Expression *)this_04);
      uVar19 = (ulong)local_4c;
      pMVar17 = local_40[0x16].wasm;
      local_4c = local_4c + 1;
    } while (uVar19 < (ulong)((long)local_40[0x17].wasm - (long)pMVar17 >> 4));
  }
  pMVar17 = local_40[0xe].wasm;
  pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar6->_id = LocalGetId;
  *(Index *)(pEVar6 + 1) = local_64;
  (pEVar6->type).id = (uintptr_t)pMVar17;
  pBVar12 = Builder::blockify(&local_38,(Expression *)local_58,pEVar6);
  (this->super_Pass)._vptr_Pass[0xc] = (_func_int *)pBVar12;
  return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Function> memoryGrow(Index memIdx, Name memoryName) {
    Builder builder(*wasm);
    Name name = memoryName.toString() + "_grow";
    Name functionName = Names::getValidFunctionName(*wasm, name);
    auto function = Builder::makeFunction(
      functionName, Signature(pointerType, pointerType), {});
    function->setLocalName(0, "page_delta");
    auto pageSizeConst = [&]() {
      return builder.makeConst(Literal(Memory::kPageSize));
    };
    auto getOffsetDelta = [&]() {
      return builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Mul),
                                builder.makeLocalGet(0, pointerType),
                                pageSizeConst());
    };
    auto getMoveSource = [&](Name global) {
      return builder.makeGlobalGet(global, pointerType);
    };
    Expression* functionBody;
    Index sizeLocal = -1;

    Index returnLocal =
      Builder::addVar(function.get(), "return_size", pointerType);
    functionBody = builder.blockify(builder.makeLocalSet(
      returnLocal, builder.makeCall(memorySizeNames[memIdx], {}, pointerType)));

    if (!isLastMemory(memIdx)) {
      sizeLocal = Builder::addVar(function.get(), "memory_size", pointerType);
      functionBody = builder.blockify(
        functionBody,
        builder.makeLocalSet(
          sizeLocal, builder.makeMemorySize(combinedMemory, memoryInfo)));
    }

    // Attempt to grow the combinedMemory. If -1 returns, enough memory could
    // not be allocated, so return -1.
    functionBody = builder.blockify(
      functionBody,
      builder.makeIf(
        builder.makeBinary(
          EqInt32,
          builder.makeMemoryGrow(
            builder.makeLocalGet(0, pointerType), combinedMemory, memoryInfo),
          builder.makeConst(-1)),
        builder.makeReturn(builder.makeConst(-1))));

    // If we are not growing the last memory, then we need to copy data,
    // shifting it over to accomodate the increase from page_delta
    if (!isLastMemory(memIdx)) {
      // This offset is the starting pt for copying
      auto offsetGlobalName = getOffsetGlobal(memIdx + 1);
      functionBody = builder.blockify(
        functionBody,
        builder.makeMemoryCopy(
          // destination
          builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                             getMoveSource(offsetGlobalName),
                             getOffsetDelta()),
          // source
          getMoveSource(offsetGlobalName),
          // size
          builder.makeBinary(
            Abstract::getBinary(pointerType, Abstract::Sub),
            builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Mul),
                               builder.makeLocalGet(sizeLocal, pointerType),
                               pageSizeConst()),
            getMoveSource(offsetGlobalName)),
          combinedMemory,
          combinedMemory));
    }

    // Adjust the offsets of the globals impacted by the memory.grow call
    for (Index i = memIdx; i < offsetGlobalNames.size(); i++) {
      auto& offsetGlobalName = offsetGlobalNames[i];
      functionBody = builder.blockify(
        functionBody,
        builder.makeGlobalSet(
          offsetGlobalName,
          builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                             getMoveSource(offsetGlobalName),
                             getOffsetDelta())));
    }

    functionBody = builder.blockify(
      functionBody, builder.makeLocalGet(returnLocal, pointerType));

    function->body = functionBody;
    return function;
  }